

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

void __thiscall tonk::Connection::Shutdown(Connection *this)

{
  atomic<int> *paVar1;
  FloodDetector *this_00;
  HostnameResolverState *pHVar2;
  tuple<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
  this_01;
  ErrorResult *pEVar3;
  allocator local_39;
  Result local_38;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,"Tonk shutdown",&local_39);
  pEVar3 = (ErrorResult *)operator_new(0x38);
  pEVar3->Source = "Connection::Shutdown";
  std::__cxx11::string::string((string *)&pEVar3->Description,local_30);
  pEVar3->Type = Tonk;
  pEVar3->Code = 0xc;
  local_38.Error = pEVar3;
  RefCounter::StartShutdown(&(this->super_IConnection).SelfRefCount,0xc,&local_38);
  Result::~Result(&local_38);
  std::__cxx11::string::~string(local_30);
  reportClose(this);
  removeFromMaps(this);
  this_00 = (this->Deps).DisconnectHandler;
  if (this_00 != (FloodDetector *)0x0) {
    FloodDetector::OnDisconnect(this_00,&(this->Deps).DisconnectAddrKey);
  }
  pHVar2 = (this->ResolverState)._M_t.
           super___uniq_ptr_impl<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
           ._M_t.
           super__Tuple_impl<0UL,_tonk::HostnameResolverState_*,_std::default_delete<tonk::HostnameResolverState>_>
           .super__Head_base<0UL,_tonk::HostnameResolverState_*,_false>._M_head_impl;
  if ((pHVar2 != (HostnameResolverState *)0x0) &&
     (this_01.
      super__Tuple_impl<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
      .
      super__Head_base<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_false>
      ._M_head_impl =
           *(_Tuple_impl<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
             *)&(pHVar2->Resolver)._M_t.
                super___uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
     , this_01.
       super__Tuple_impl<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
       .
       super__Head_base<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_false>
       ._M_head_impl !=
       (_Head_base<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_false>
        )0x0)) {
    asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>::cancel
              ((basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_> *)
               this_01.
               super__Tuple_impl<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
               .
               super__Head_base<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_false>
               ._M_head_impl);
    std::
    __uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
    ::reset((__uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
             *)&((this->ResolverState)._M_t.
                 super___uniq_ptr_impl<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_tonk::HostnameResolverState_*,_std::default_delete<tonk::HostnameResolverState>_>
                 .super__Head_base<0UL,_tonk::HostnameResolverState_*,_false>._M_head_impl)->
                Resolver,(pointer)0x0);
    std::
    __uniq_ptr_impl<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
    ::reset((__uniq_ptr_impl<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
             *)&this->ResolverState,(pointer)0x0);
  }
  std::__uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>::
  reset((__uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_> *
        )&this->AsioEventStrand,(pointer)0x0);
  std::
  __uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
  ::reset((__uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
           *)&this->Ticker,(pointer)0x0);
  std::__uniq_ptr_impl<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>::reset
            ((__uniq_ptr_impl<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_> *)
             &this->HolePuncher,(pointer)0x0);
  SessionIncoming::Shutdown(&this->Incoming);
  SessionOutgoing::Shutdown(&this->Outgoing);
  LOCK();
  paVar1 = &((this->Deps).SocketRefCount)->RefCount;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  return;
}

Assistant:

void Connection::Shutdown()
{
    TONK_DEBUG_ASSERT(!SelfRefCount.ObjectInUse());

    // Make sure that at least one Disconnect has occurred
    SelfRefCount.StartShutdown(
        Tonk_AppRequest,
        Result("Connection::Shutdown", "Tonk shutdown", ErrorType::Tonk, Tonk_AppRequest));

    reportClose();

    removeFromMaps();

    // If the flood detection subsystem needs to be notified of a disconnect:
    if (Deps.DisconnectHandler) {
        Deps.DisconnectHandler->OnDisconnect(Deps.DisconnectAddrKey);
    }

    if (ResolverState && ResolverState->Resolver)
    {
        ResolverState->Resolver->cancel();
        ResolverState->Resolver = nullptr;
        ResolverState = nullptr;
    }

    // Kill the strand
    AsioEventStrand = nullptr;
    Ticker = nullptr;
    HolePuncher = nullptr;

    // Shut down most connected objects first:

    Incoming.Shutdown();
    Outgoing.Shutdown();

#ifdef TONK_DETAILED_STATS

    Deets.WriteJsonToFile();
    Logger.Info("Detailed statistics consumed ", Deets.GetMemoryUsed(), " bytes");

#endif

    // Release reference to socket
    Deps.SocketRefCount->DecrementReferences();
}